

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O1

Node * __thiscall
rengine::AllocationPool<rengine::Node>::allocate(AllocationPool<rengine::Node> *this)

{
  uint uVar1;
  Node *pNVar2;
  uint *puVar3;
  
  uVar1 = this->m_nextFree;
  if (this->m_poolSize <= uVar1) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,"T *rengine::AllocationPool<rengine::Node>::allocate() [T = rengine::Node]")
    ;
  }
  pNVar2 = this->m_memory;
  if (pNVar2 == (Node *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,"T *rengine::AllocationPool<rengine::Node>::allocate() [T = rengine::Node]")
    ;
  }
  puVar3 = this->m_free;
  if (puVar3 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,"T *rengine::AllocationPool<rengine::Node>::allocate() [T = rengine::Node]")
    ;
  }
  if (puVar3[uVar1] < this->m_poolSize) {
    this->m_nextFree = uVar1 + 1;
    uVar1 = puVar3[uVar1];
    pNVar2[uVar1].super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    pNVar2[uVar1].super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_00115b88;
    pNVar2[uVar1].m_parent = (Node *)0x0;
    (&pNVar2[uVar1].m_parent)[1] = (Node *)0x0;
    pNVar2[uVar1].m_next = (Node *)0x0;
    (&pNVar2[uVar1].m_next)[1] = (Node *)0x0;
    *(uint *)&pNVar2[uVar1].field_0x30 = *(uint *)&pNVar2[uVar1].field_0x30 & 0xfffff800;
    return pNVar2 + uVar1;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,"T *rengine::AllocationPool<rengine::Node>::allocate() [T = rengine::Node]");
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }